

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::Instance::CallInitFunc
          (Instance *this,Store *store,Ref func_ref,Value *result,Ptr *out_trap)

{
  bool bVar1;
  Func *this_00;
  size_type sVar2;
  reference pvVar3;
  vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> local_90;
  Enum local_74;
  size_t local_70;
  undefined1 local_68 [8];
  Ptr func;
  Values results;
  Ptr *out_trap_local;
  Value *result_local;
  Store *store_local;
  Instance *this_local;
  Ref func_ref_local;
  
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&func.root_index_)
  ;
  local_70 = func_ref.index;
  RefPtr<wabt::interp::Func>::RefPtr((RefPtr<wabt::interp::Func> *)local_68,store,func_ref);
  this_00 = RefPtr<wabt::interp::Func>::operator->((RefPtr<wabt::interp::Func> *)local_68);
  memset(&local_90,0,0x18);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector(&local_90);
  local_74 = (Enum)Func::Call(this_00,store,&local_90,(Values *)&func.root_index_,out_trap,
                              (Stream *)0x0);
  bVar1 = Failed((Result)local_74);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector(&local_90);
  if (bVar1) {
    Result::Result((Result *)((long)&func_ref_local.index + 4),Error);
  }
  else {
    sVar2 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                      ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                       &func.root_index_);
    if (sVar2 != 1) {
      __assert_fail("results.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                    ,0x2aa,
                    "Result wabt::interp::Instance::CallInitFunc(Store &, const Ref, Value *, Trap::Ptr *)"
                   );
    }
    pvVar3 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::operator[]
                       ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                        &func.root_index_,0);
    (result->field_0).i64_ = (pvVar3->field_0).i64_;
    *(undefined8 *)((long)&result->field_0 + 8) = *(undefined8 *)((long)&pvVar3->field_0 + 8);
    Result::Result((Result *)((long)&func_ref_local.index + 4),Ok);
  }
  RefPtr<wabt::interp::Func>::~RefPtr((RefPtr<wabt::interp::Func> *)local_68);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&func.root_index_)
  ;
  return (Result)func_ref_local.index._4_4_;
}

Assistant:

Result Instance::CallInitFunc(Store& store,
                              const Ref func_ref,
                              Value* result,
                              Trap::Ptr* out_trap) {
  Values results;
  Func::Ptr func{store, func_ref};
  if (Failed(func->Call(store, {}, results, out_trap))) {
    return Result::Error;
  }
  assert(results.size() == 1);
  *result = results[0];
  return Result::Ok;
}